

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorEnterDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  type_conflict5 tVar1;
  char *pcVar2;
  int *piVar3;
  IdxElement *pIVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 in_RSI;
  long in_RDI;
  int i_1;
  int i;
  IdxElement price;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int nsorted;
  int idx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *coWeights_ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *coTest;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined1 in_stack_0000061f;
  int in_stack_00000620;
  int in_stack_00000624;
  int in_stack_00000628;
  int in_stack_0000062c;
  IdxCompare *in_stack_00000630;
  IdxElement *in_stack_00000638;
  int in_stack_00000650;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 uVar6;
  int in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffb64;
  long in_stack_fffffffffffffb70;
  int i_00;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb78;
  int local_45c;
  undefined1 local_458 [128];
  undefined1 local_3d8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc88;
  undefined1 local_358 [128];
  undefined1 local_2d8 [128];
  undefined1 local_258 [128];
  uint local_1d8;
  int local_1d4;
  undefined1 auStack_1d0 [128];
  undefined1 local_150 [128];
  int local_d0;
  int local_cc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined8 local_b0;
  DataKey local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined8 local_48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_b0 = in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::coTest(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             **)(in_RDI + 0x10));
  local_c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x774d32);
  local_c8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x774d52);
  local_98 = local_150;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::IdxElement::IdxElement
            ((IdxElement *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::clear((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
           *)0x774d95);
  IdxSet::clear((IdxSet *)(in_RDI + 0x180));
  local_1d8 = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x1380));
  uVar5 = extraout_RDX;
  while (local_1d8 = local_1d8 - 1, -1 < (int)local_1d8) {
    pcVar2 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x1380),(char *)(ulong)local_1d8,
                           (int)uVar5);
    local_cc = (int)pcVar2;
    local_40 = local_c0 + local_cc;
    local_38 = local_150;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_20 = local_258;
    local_28 = in_RDX;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,in_RDX);
    local_10 = local_258;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_8 = local_258;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x774ed3);
    if (tVar1) {
      piVar3 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x1400),local_cc);
      *piVar3 = 1;
      local_88 = local_358;
      local_90 = local_150;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      local_80 = local_c8 + local_cc;
      local_78 = local_3d8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      local_68 = local_458;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      local_58 = auStack_1d0;
      local_60 = local_2d8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      local_1d4 = local_cc;
      Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
      ::append((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (IdxElement *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      uVar5 = extraout_RDX_00;
    }
    else {
      IdxSet::remove((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x1380),(char *)(ulong)local_1d8);
      piVar3 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x1400),local_cc);
      *piVar3 = 0;
      uVar5 = extraout_RDX_01;
    }
  }
  pIVar4 = Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
           ::get_const_ptr((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                            *)0x775091);
  *(IdxElement **)(in_RDI + 0xa8) = pIVar4;
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::get_ptr((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
             *)0x7750a9);
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::size((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
          *)0x7750cd);
  uVar6 = 0;
  uVar7 = 1;
  local_d0 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                       (in_stack_00000638,in_stack_00000630,in_stack_0000062c,in_stack_00000628,
                        in_stack_00000624,in_stack_00000620,in_stack_00000650,
                        (bool)in_stack_0000061f);
  for (local_45c = 0; i_00 = (int)((ulong)in_stack_fffffffffffffb70 >> 0x20), local_45c < local_d0;
      local_45c = local_45c + 1) {
    in_stack_fffffffffffffb70 = in_RDI + 0x180;
    Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
    ::operator[]((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                  *)CONCAT44(in_stack_fffffffffffffb64,uVar7),in_stack_fffffffffffffb5c);
    DIdxSet::addIdx((DIdxSet *)CONCAT44(in_stack_fffffffffffffb64,uVar7),in_stack_fffffffffffffb5c);
    in_stack_fffffffffffffb78 =
         (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)(*(long *)(in_RDI + 0x10) + 0x1400);
    pIVar4 = Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
             ::operator[]((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                           *)CONCAT44(in_stack_fffffffffffffb64,uVar7),in_stack_fffffffffffffb5c);
    piVar3 = DataArray<int>::operator[]((DataArray<int> *)in_stack_fffffffffffffb78,pIVar4->idx);
    *piVar3 = 2;
  }
  if (local_d0 < 1) {
    SPxId::SPxId((SPxId *)0x775214);
  }
  else {
    pIVar4 = Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
             ::operator[]((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                           *)CONCAT44(in_stack_fffffffffffffb64,uVar7),in_stack_fffffffffffffb5c);
    local_50 = &pIVar4->val;
    local_48 = local_b0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)CONCAT44(in_stack_fffffffffffffb64,uVar7),
               (cpp_dec_float<200U,_int,_void> *)CONCAT44(in_stack_fffffffffffffb5c,uVar6));
    Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
    ::operator[]((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
                  *)CONCAT44(in_stack_fffffffffffffb64,uVar7),in_stack_fffffffffffffb5c);
    local_a0 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::coId(in_stack_fffffffffffffb78,i_00);
  }
  return (SPxId)local_a0;
}

Assistant:

SPxId SPxSteepPR<R>::buildBestPriceVectorEnterDim(R& best, R feastol)
{
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   int idx;
   int nsorted;
   R x;
   typename SPxPricer<R>::IdxElement price;

   prices.clear();
   bestPrices.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = coTest[idx];

      if(x < -feastol)
      {
         // it might happen that we call the pricer with a tighter tolerance than what was used when computing the violations
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.val = steeppr::computePrice(x, coWeights_ptr[idx], feastol);
         price.idx = idx;
         prices.append(price);
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = prices[0].val;
      return this->thesolver->coId(prices[0].idx);
   }
   else
      return SPxId();
}